

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessConvert(ConvertToHalfPass *this,Instruction *inst)

{
  IRContext *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  const_iterator cVar4;
  Instruction *this_00;
  uint32_t uVar5;
  __hashtable *__h;
  __node_gen_type __node_gen;
  undefined1 local_50 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_30;
  
  bVar2 = IsFloat(this,inst,0x20);
  if (bVar2) {
    uVar3 = 0;
    if (inst->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
    }
    local_50._0_4_ = uVar3;
    cVar4 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->relaxed_ids_set_)._M_h,(key_type_conflict *)local_50);
    if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      uVar3 = 0;
      if (inst->has_type_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(inst,0);
      }
      local_50._16_4_ = EquivFloatTypeId(this,uVar3,0x10);
      if (inst->has_type_id_ == false) {
        __assert_fail("has_type_id_",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2de,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
      }
      if ((_Type)local_50._16_4_ == (_Type)0x0) {
        __assert_fail("ty_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2e3,"void spvtools::opt::Instruction::SetResultType(uint32_t)");
      }
      local_50._24_8_ = local_50 + 0x10;
      local_50._0_8_ = &PTR__SmallVector_00b02ef8;
      local_30._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_50._8_8_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                (&((inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start)->words,
                 (SmallVector<unsigned_int,_2UL> *)local_50);
      local_50._0_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
          local_30._M_head_impl !=
          (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_30,local_30._M_head_impl);
      }
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar1);
      }
      analysis::DefUseManager::AnalyzeInstUse
                ((pIVar1->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,inst);
      if (inst->has_result_id_ == true) {
        Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
      }
      local_50._0_8_ = &this->converted_ids_;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                (&this->converted_ids_);
    }
  }
  uVar3 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar3 = (uint)inst->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(inst,uVar3);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = analysis::DefUseManager::GetDef
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar3);
  uVar5 = 0;
  uVar3 = 0;
  if (inst->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(inst,0);
  }
  if (this_00->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(this_00,0);
  }
  if (uVar3 == uVar5) {
    inst->opcode_ = OpCopyObject;
  }
  return true;
}

Assistant:

bool ConvertToHalfPass::ProcessConvert(Instruction* inst) {
  // If float32 and relaxed, change to float16 convert
  if (IsFloat(inst, 32) && IsRelaxed(inst->result_id())) {
    inst->SetResultType(EquivFloatTypeId(inst->type_id(), 16));
    get_def_use_mgr()->AnalyzeInstUse(inst);
    converted_ids_.insert(inst->result_id());
  }
  // If operand and result types are the same, change FConvert to CopyObject to
  // keep validator happy; simplification and DCE will clean it up
  // One way this can happen is if an FConvert generated during this pass
  // (likely by ProcessPhi) is later encountered here and its operand has been
  // changed to half.
  uint32_t val_id = inst->GetSingleWordInOperand(0);
  Instruction* val_inst = get_def_use_mgr()->GetDef(val_id);
  if (inst->type_id() == val_inst->type_id())
    inst->SetOpcode(spv::Op::OpCopyObject);
  return true;  // modified
}